

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::AdvancedWriteFragmentFS::Run(AdvancedWriteFragmentFS *this)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  GLuint GVar3;
  GLint location;
  long lVar4;
  uvec4 zero;
  int bad_pixels;
  undefined1 local_98 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  int local_58;
  vec3 local_54;
  undefined1 *local_48;
  float local_40;
  vec3 local_3c;
  
  bVar2 = ShaderStorageBufferObjectBase::IsVSFSAvailable
                    (&this->super_ShaderStorageBufferObjectBase,0,1);
  lVar4 = 0x10;
  if (bVar2) {
    paVar1 = &local_78.field_2;
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "\nout vec2 position;\nout vec3 color;\nvec2 g_quad[4] = vec2[4](vec2(-0.4, -0.4), vec2(0.4, -0.4), vec2(-0.4, 0.4), vec2(0.4, 0.4));\nvec2 g_offset[4] = vec2[4](vec2(-0.5, -0.5), vec2(0.5, -0.5), vec2(-0.5, 0.5), vec2(0.5, 0.5));\nvec3 g_color[4] = vec3[4](vec3(1, 0, 0), vec3(0, 1, 0), vec3(0, 0, 1), vec3(1, 1, 0));\nvoid main() {\n  vec2 pos = g_quad[gl_VertexID] + g_offset[gl_InstanceID];\n  gl_Position = vec4(pos, 0, 1);\n  position = pos;\n  color = g_color[gl_InstanceID];\n}"
               ,"");
    local_98._0_8_ = &local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_98,
               "\nin vec2 position;\nin vec3 color;\nlayout(location = 0) out vec4 g_fs_out;\nstruct FragmentData {\n  vec2 position;\n  vec3 color;\n};\nlayout(std430, binding = 3) buffer Output {\n  FragmentData g_fragment[6400];\n};\nuniform uint g_max_fragment_count;\nlayout(binding = 2, offset = 0) uniform atomic_uint g_fragment_counter;\nvoid main() {\n  uint fragment_number = atomicCounterIncrement(g_fragment_counter);\n  if (fragment_number < g_max_fragment_count) {\n    g_fragment[fragment_number].position = position;\n    g_fragment[fragment_number].color = color;\n  }\n  g_fs_out = vec4(color, 1);\n}"
               ,"");
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_78,(string *)local_98);
    this->m_program[0] = GVar3;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._0_8_ != &local_88) {
      operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[0]);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program[0]);
    lVar4 = -1;
    if (bVar2) {
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,
                 "\nlayout(location = 0) in vec4 g_in_position;\nlayout(location = 1) in vec4 g_in_color;\nout vec3 color;\nvoid main() {\n  gl_Position = vec4(g_in_position.xy, 0, 1);\n#ifdef GL_ES\n  gl_PointSize = 1.0f;\n#endif\n  color = g_in_color.rgb;\n}"
                 ,"");
      local_98._0_8_ = &local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,
                 "\nin vec3 color;\nlayout(location = 0) out vec4 g_fs_out;\nvoid main() {\n  g_fs_out = vec4(color, 1);\n}"
                 ,"");
      GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                        (&this->super_ShaderStorageBufferObjectBase,&local_78,(string *)local_98);
      this->m_program[1] = GVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._0_8_ != &local_88) {
        operator_delete((void *)local_98._0_8_,local_88._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[1]);
      bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                        (&this->super_ShaderStorageBufferObjectBase,this->m_program[1]);
      if (bVar2) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,this->m_storage_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x32000,(void *)0x0,0x88e8);
        glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_counter_buffer);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x92c0,2,this->m_counter_buffer);
        glu::CallLogWrapper::glBufferData(this_00,0x92c0,4,(void *)0x0,0x88e8);
        local_78._M_dataplus._M_p = (pointer)0x0;
        local_78._M_string_length = 0;
        glu::CallLogWrapper::glBufferSubData(this_00,0x92c0,0,4,&local_78);
        glu::CallLogWrapper::glBindTexture(this_00,0xde1,this->m_rt);
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
        glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
        glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8058,100,100);
        glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
        glu::CallLogWrapper::glViewport(this_00,0,0,100,100);
        glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
        glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,this->m_rt,0);
        glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_attribless_vertex_array);
        glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_draw_vertex_array);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_draw_vertex_array);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_storage_buffer);
        glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x20,(void *)0x0);
        glu::CallLogWrapper::glVertexAttribPointer(this_00,1,4,0x1406,'\0',0x20,(void *)0x10);
        glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
        glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
        glu::CallLogWrapper::glBindVertexArray(this_00,0);
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glUseProgram(this_00,this->m_program[0]);
        location = glu::CallLogWrapper::glGetUniformLocation
                             (this_00,this->m_program[0],"g_max_fragment_count");
        glu::CallLogWrapper::glUniform1ui(this_00,location,0x1900);
        glu::CallLogWrapper::glBindVertexArray(this_00,this->m_attribless_vertex_array);
        glu::CallLogWrapper::glDrawArraysInstanced(this_00,5,0,4,4);
        local_98._0_8_ = (pointer)0x3f800000;
        local_98._8_4_ = 0.0;
        local_3c.m_data[0] = 0.0;
        local_3c.m_data[1] = 1.0;
        local_3c.m_data[2] = 0.0;
        local_48 = &DAT_3f8000003f800000;
        local_40 = 0.0;
        local_54.m_data[0] = 0.0;
        local_54.m_data[1] = 0.0;
        local_54.m_data[2] = 1.0;
        bVar2 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                          (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_98,&local_3c,
                           (vec3 *)&local_48,&local_54,(int *)0x0);
        lVar4 = -1;
        if (bVar2) {
          glu::CallLogWrapper::glClear(this_00,0x4000);
          glu::CallLogWrapper::glUseProgram(this_00,this->m_program[1]);
          glu::CallLogWrapper::glBindVertexArray(this_00,this->m_draw_vertex_array);
          glu::CallLogWrapper::glMemoryBarrier(this_00,1);
          glu::CallLogWrapper::glDrawArrays(this_00,0,0,0x1900);
          local_98._0_8_ = (pointer)0x3f800000;
          local_98._8_4_ = 0.0;
          local_3c.m_data[0] = 0.0;
          local_3c.m_data[1] = 1.0;
          local_3c.m_data[2] = 0.0;
          local_48 = &DAT_3f8000003f800000;
          local_40 = 0.0;
          local_54.m_data[0] = 0.0;
          local_54.m_data[1] = 0.0;
          local_54.m_data[2] = 1.0;
          bVar2 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                            (&this->super_ShaderStorageBufferObjectBase,(vec3 *)local_98,&local_3c,
                             (vec3 *)&local_48,&local_54,&local_58);
          lVar4 = -(ulong)(byte)(~bVar2 & 2 < local_58);
        }
      }
    }
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		if (!IsVSFSAvailable(0, 1))
			return NOT_SUPPORTED;
		const char* const glsl_vs0 =
			NL "out vec2 position;" NL "out vec3 color;" NL
			   "vec2 g_quad[4] = vec2[4](vec2(-0.4, -0.4), vec2(0.4, -0.4), vec2(-0.4, 0.4), vec2(0.4, 0.4));" NL
			   "vec2 g_offset[4] = vec2[4](vec2(-0.5, -0.5), vec2(0.5, -0.5), vec2(-0.5, 0.5), vec2(0.5, 0.5));" NL
			   "vec3 g_color[4] = vec3[4](vec3(1, 0, 0), vec3(0, 1, 0), vec3(0, 0, 1), vec3(1, 1, 0));" NL
			   "void main() {" NL "  vec2 pos = g_quad[gl_VertexID] + g_offset[gl_InstanceID];" NL
			   "  gl_Position = vec4(pos, 0, 1);" NL "  position = pos;" NL "  color = g_color[gl_InstanceID];" NL "}";
		const char* const glsl_fs0 =
			NL "in vec2 position;" NL "in vec3 color;" NL "layout(location = 0) out vec4 g_fs_out;" NL
			   "struct FragmentData {" NL "  vec2 position;" NL "  vec3 color;" NL "};" NL
			   "layout(std430, binding = 3) buffer Output {" NL "  FragmentData g_fragment[6400];" NL "};" NL
			   "uniform uint g_max_fragment_count;" NL
			   "layout(binding = 2, offset = 0) uniform atomic_uint g_fragment_counter;" NL "void main() {" NL
			   "  uint fragment_number = atomicCounterIncrement(g_fragment_counter);" NL
			   "  if (fragment_number < g_max_fragment_count) {" NL
			   "    g_fragment[fragment_number].position = position;" NL
			   "    g_fragment[fragment_number].color = color;" NL "  }" NL "  g_fs_out = vec4(color, 1);" NL "}";
		m_program[0] = CreateProgram(glsl_vs0, glsl_fs0);
		glLinkProgram(m_program[0]);
		if (!CheckProgram(m_program[0]))
			return ERROR;

		const char* const glsl_vs1 =
			NL "layout(location = 0) in vec4 g_in_position;" NL "layout(location = 1) in vec4 g_in_color;" NL
			   "out vec3 color;" NL "void main() {" NL "  gl_Position = vec4(g_in_position.xy, 0, 1);" NL
			   "#ifdef GL_ES" NL "  gl_PointSize = 1.0f;" NL "#endif" NL "  color = g_in_color.rgb;" NL "}";
		const char* const glsl_fs1 = NL "in vec3 color;" NL "layout(location = 0) out vec4 g_fs_out;" NL
										"void main() {" NL "  g_fs_out = vec4(color, 1);" NL "}";
		m_program[1] = CreateProgram(glsl_vs1, glsl_fs1);
		glLinkProgram(m_program[1]);
		if (!CheckProgram(m_program[1]))
			return ERROR;

		// The first pass renders four squares on-screen, and writes a
		// record to the SSBO for each fragment processed.  The rectangles
		// will be 40x40 when using a 100x100 viewport, so we expect 1600
		// pixels per rectangle or 6400 pixels total.  Size the SSBO
		// accordingly, and render the second pass (sourcing the SSBO as a
		// vertex buffer) with an identical number of points.  If we have
		// a larger buffer and draw more points on the second pass, those
		// may overwrite "real" points using garbage position/color.
		int expectedPixels = 6400;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, expectedPixels * 32, NULL, GL_DYNAMIC_DRAW);

		glGenBuffers(1, &m_counter_buffer);
		glBindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 2, m_counter_buffer);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 4, NULL, GL_DYNAMIC_DRAW);
		uvec4 zero(0);
		glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, 4, &zero);

		glBindTexture(GL_TEXTURE_2D, m_rt);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 100, 100);
		glBindTexture(GL_TEXTURE_2D, 0);
		glViewport(0, 0, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_rt, 0);

		glGenVertexArrays(1, &m_attribless_vertex_array);

		glGenVertexArrays(1, &m_draw_vertex_array);
		glBindVertexArray(m_draw_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_storage_buffer);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 32, 0);
		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, 32, reinterpret_cast<void*>(16));
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(1);
		glBindVertexArray(0);

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[0]);
		glUniform1ui(glGetUniformLocation(m_program[0], "g_max_fragment_count"), expectedPixels);
		glBindVertexArray(m_attribless_vertex_array);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 4);
		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1)))
		{
			return ERROR;
		}

		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(m_program[1]);
		glBindVertexArray(m_draw_vertex_array);
		glMemoryBarrier(GL_VERTEX_ATTRIB_ARRAY_BARRIER_BIT);
		glDrawArrays(GL_POINTS, 0, expectedPixels);
		int bad_pixels;
		if (!ValidateWindow4Quads(vec3(1, 0, 0), vec3(0, 1, 0), vec3(1, 1, 0), vec3(0, 0, 1), &bad_pixels) &&
			bad_pixels > 2)
		{
			return ERROR;
		}

		return NO_ERROR;
	}